

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallRef(TranslateToFuzzReader *this,Type type)

{
  Module *pMVar1;
  IString *pIVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  uint32_t uVar4;
  uintptr_t *puVar5;
  Expression *pEVar6;
  RefFunc *target;
  CallRef *pCVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  long lVar8;
  Type *pTVar9;
  bool isReturn;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  Type local_78;
  Expression *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Iterator __begin1;
  
  lVar8 = 0xb;
  while (lVar8 = lVar8 + -1, lVar8 != 0) {
    pMVar1 = this->wasm;
    if (*(long *)(pMVar1 + 0x18) == *(long *)(pMVar1 + 0x20)) break;
    uVar4 = Random::upTo(&this->random,
                         (uint32_t)
                         ((ulong)(*(long *)(pMVar1 + 0x20) - *(long *)(pMVar1 + 0x18)) >> 3));
    pIVar2 = *(IString **)(*(long *)(pMVar1 + 0x18) + (ulong)uVar4 * 8);
    if ((type.id == 1) && (((byte)this->wasm[0x108] & 0x80) != 0)) {
      wasm::HeapType::getSignature();
      wasm::HeapType::getSignature();
      isReturn = extraout_RDX == extraout_RDX_00;
    }
    else {
      isReturn = false;
    }
    wasm::HeapType::getSignature();
    if ((isReturn != false) || (extraout_RDX_01 == type.id)) {
      auStack_68 = (undefined1  [8])0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.id = wasm::HeapType::getSignature();
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&local_78;
      PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_78);
      pTVar9 = &local_78;
      for (; PVar3.index = (size_t)__begin1.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar3.parent = pTVar9, PVar10 != PVar3;
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        puVar5 = (uintptr_t *)
                 wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &args.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_70 = make(this,(Type)*puVar5);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                   &local_70);
        pTVar9 = (Type *)args.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      target = Builder::makeRefFunc
                         (&this->builder,(Name)pIVar2->str,
                          (HeapType)*(uintptr_t *)((long)(pIVar2 + 3) + 8));
      pCVar7 = Builder::
               makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                         (&this->builder,(Expression *)target,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_68,type,isReturn);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68
                );
      return (Expression *)pCVar7;
    }
  }
  pEVar6 = makeTrivial(this,type);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallRef(Type type) {
  // look for a call target with the right type
  Function* target;
  bool isReturn;
  size_t i = 0;
  while (1) {
    if (i == TRIES || wasm.functions.empty()) {
      // We can't find a proper target, give up.
      return makeTrivial(type);
    }
    // TODO: handle unreachable
    target = wasm.functions[upTo(wasm.functions.size())].get();
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() == type || isReturn) {
      break;
    }
    i++;
  }
  std::vector<Expression*> args;
  for (const auto& type : target->getParams()) {
    args.push_back(make(type));
  }
  // TODO: half the time make a completely random item with that type.
  return builder.makeCallRef(
    builder.makeRefFunc(target->name, target->type), args, type, isReturn);
}